

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_debug_impl_glUniform4f(GLint arg0,GLfloat arg1,GLfloat arg2,GLfloat arg3,GLfloat arg4)

{
  GLfloat arg4_local;
  GLfloat arg3_local;
  GLfloat arg2_local;
  GLfloat arg1_local;
  GLint arg0_local;
  
  (*_pre_call_callback)
            ("glUniform4f",glad_debug_glUniform4f,5,(double)arg1,(double)arg2,(double)arg3,
             (double)arg4,(ulong)(uint)arg0);
  (*glad_glUniform4f)(arg0,arg1,arg2,arg3,arg4);
  (*_post_call_callback)
            ("glUniform4f",glad_debug_glUniform4f,5,(double)arg1,(double)arg2,(double)arg3,
             (double)arg4,(ulong)(uint)arg0);
  return;
}

Assistant:

void APIENTRY glad_debug_impl_glUniform4f(GLint arg0, GLfloat arg1, GLfloat arg2, GLfloat arg3, GLfloat arg4) {    
    _pre_call_callback("glUniform4f", (void*)glUniform4f, 5, arg0, arg1, arg2, arg3, arg4);
     glad_glUniform4f(arg0, arg1, arg2, arg3, arg4);
    _post_call_callback("glUniform4f", (void*)glUniform4f, 5, arg0, arg1, arg2, arg3, arg4);
    
}